

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_glob.c
# Opt level: O1

void max_default(t_pd *x,t_symbol *s,int argc,t_atom *argv)

{
  char *pcVar1;
  ulong uVar2;
  char str [80];
  char acStack_78 [88];
  
  pcVar1 = class_getname(*x);
  startpost("%s: unknown message %s ",pcVar1,s->s_name);
  if (0 < argc) {
    uVar2 = (ulong)(uint)argc;
    do {
      atom_string(argv,acStack_78,0x50);
      poststring(acStack_78);
      argv = argv + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  endpost();
  return;
}

Assistant:

void max_default(t_pd *x, t_symbol *s, int argc, t_atom *argv)
{
    int i;
    char str[80];
    startpost("%s: unknown message %s ", class_getname(pd_class(x)),
        s->s_name);
    for (i = 0; i < argc; i++)
    {
        atom_string(argv+i, str, 80);
        poststring(str);
    }
    endpost();
}